

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

int main(int argc,char **argv)

{
  char local_2c [8];
  char buffer [12];
  mraa_uart_context uart;
  char **argv_local;
  int argc_local;
  
  builtin_strncpy(local_2c,"Hello Mr",8);
  builtin_strncpy(buffer,"aa!",4);
  signal(2,sig_handler);
  mraa_init();
  buffer._4_8_ = mraa_uart_init(0);
  if (buffer._4_8_ == 0) {
    fprintf(_stderr,"Failed to initialize UART\n");
    mraa_deinit();
    argv_local._4_4_ = 1;
  }
  else {
    while (flag != 0) {
      mraa_uart_write(buffer._4_8_,local_2c,0xc);
      sleep(1);
    }
    mraa_uart_stop(buffer._4_8_);
    mraa_deinit();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_uart_context uart;
    char buffer[] = "Hello Mraa!";

    /* install signal handler */
    signal(SIGINT, sig_handler);

    /* initialize mraa for the platform (not needed most of the times) */
    mraa_init();

    //! [Interesting]
    /* initialize UART */
    uart = mraa_uart_init(UART);
    if (uart == NULL) {
        fprintf(stderr, "Failed to initialize UART\n");
        goto err_exit;
    }

    while (flag) {
        /* send data through UART */
        mraa_uart_write(uart, buffer, sizeof(buffer));

        sleep(1);
    }

    /* stop UART */
    mraa_uart_stop(uart);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}